

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O2

bool __thiscall Diligent::ThreadPoolImpl::ReprioritizeTask(ThreadPoolImpl *this,IAsyncTask *pTask)

{
  _Base_ptr p_Var1;
  iterator __position;
  _Rb_tree_header *p_Var2;
  float extraout_XMM0_Da;
  float Priority;
  unique_lock<std::mutex> lock;
  float local_54;
  QueuedTaskInfo local_50;
  unique_lock<std::mutex> local_30;
  
  (*(pTask->super_IObject)._vptr_IObject[9])(pTask);
  std::unique_lock<std::mutex>::unique_lock(&local_30,&this->m_TasksQueueMtx);
  __position._M_node = (this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var2 = &(this->m_TasksQueue)._M_t._M_impl.super__Rb_tree_header;
  do {
    if ((_Rb_tree_header *)__position._M_node == p_Var2) {
LAB_004740e9:
      std::unique_lock<std::mutex>::~unique_lock(&local_30);
      return (_Rb_tree_header *)__position._M_node != p_Var2;
    }
    p_Var1 = __position._M_node[1]._M_parent;
    if (p_Var1 == (_Base_ptr)pTask) {
      if (((float)__position._M_node[1]._M_color != extraout_XMM0_Da) ||
         (NAN((float)__position._M_node[1]._M_color) || NAN(extraout_XMM0_Da))) {
        __position._M_node[1]._M_parent = (_Base_ptr)0x0;
        local_50.Prerequisites.
        super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)__position._M_node[1]._M_left;
        local_50.Prerequisites.
        super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)__position._M_node[1]._M_right;
        local_50.Prerequisites.
        super__Vector_base<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>,_std::allocator<Diligent::RefCntWeakPtr<Diligent::IAsyncTask>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = *(pointer *)(__position._M_node + 2);
        __position._M_node[1]._M_left = (_Base_ptr)0x0;
        __position._M_node[1]._M_right = (_Base_ptr)0x0;
        *(undefined8 *)(__position._M_node + 2) = 0;
        local_50.pTask.m_pObject = (IAsyncTask *)p_Var1;
        std::
        _Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
        ::erase_abi_cxx11_((_Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                            *)&this->m_TasksQueue,__position);
        std::
        _Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
        ::_M_emplace_equal<float_const&,Diligent::ThreadPoolImpl::QueuedTaskInfo>
                  ((_Rb_tree<float,std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>,std::_Select1st<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>,std::greater<float>,std::allocator<std::pair<float_const,Diligent::ThreadPoolImpl::QueuedTaskInfo>>>
                    *)&this->m_TasksQueue,&local_54,&local_50);
        QueuedTaskInfo::~QueuedTaskInfo(&local_50);
      }
      goto LAB_004740e9;
    }
    __position._M_node = (_Base_ptr)std::_Rb_tree_increment(__position._M_node);
  } while( true );
}

Assistant:

ReprioritizeTask(IAsyncTask* pTask) override final
    {
        const auto Priority = pTask->GetPriority();

        std::unique_lock<std::mutex> lock{m_TasksQueueMtx};

        auto it = m_TasksQueue.begin();
        while (it != m_TasksQueue.end() && it->second.pTask != pTask)
            ++it;
        if (it != m_TasksQueue.end())
        {
            if (it->first != Priority)
            {
                auto ExistingTaskInfo = std::move(it->second);
                m_TasksQueue.erase(it);
                m_TasksQueue.emplace(Priority, std::move(ExistingTaskInfo));
            }

            return true;
        }
        return false;
    }